

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O1

void __thiscall wasm::PoppifyPass::run(PoppifyPass *this,Module *module)

{
  undefined1 local_110 [8];
  PassRunner subRunner;
  
  PassRunner::PassRunner((PassRunner *)local_110,(this->super_Pass).runner);
  subRunner._232_8_ = operator_new(0x58);
  *(undefined8 *)subRunner._232_8_ = 0;
  *(undefined8 *)(subRunner._232_8_ + 8) = 0;
  *(undefined8 *)(subRunner._232_8_ + 0x10) = 0;
  *(undefined8 *)(subRunner._232_8_ + 0x18) = 0;
  *(undefined8 *)(subRunner._232_8_ + 0x20) = 0;
  *(undefined8 *)(subRunner._232_8_ + 0x28) = 0;
  *(undefined8 *)(subRunner._232_8_ + 0x50) = 0;
  *(undefined8 *)(subRunner._232_8_ + 0x40) = 0;
  *(undefined8 *)(subRunner._232_8_ + 0x48) = 0;
  *(undefined8 *)(subRunner._232_8_ + 0x30) = 0;
  *(undefined8 *)(subRunner._232_8_ + 0x38) = 0;
  *(undefined8 *)(subRunner._232_8_ + 8) = 0;
  *(undefined8 **)(subRunner._232_8_ + 0x10) = (undefined8 *)(subRunner._232_8_ + 0x20);
  *(undefined8 *)(subRunner._232_8_ + 0x18) = 0;
  *(undefined1 *)(subRunner._232_8_ + 0x20) = 0;
  *(undefined1 *)(subRunner._232_8_ + 0x50) = 0;
  *(undefined ***)subRunner._232_8_ = &PTR__Pass_01094308;
  PassRunner::add((PassRunner *)local_110,
                  (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&subRunner.isNested);
  if (subRunner._232_8_ != 0) {
    (**(code **)(*(long *)subRunner._232_8_ + 8))();
  }
  subRunner.isNested = false;
  subRunner.addedPassesRemovedDWARF = false;
  subRunner._234_6_ = 0;
  PassRunner::run((PassRunner *)local_110);
  lowerTupleGlobals(this,module);
  PassRunner::~PassRunner((PassRunner *)local_110);
  return;
}

Assistant:

void run(Module* module) {
    PassRunner subRunner(getPassRunner());
    subRunner.add(std::make_unique<PoppifyFunctionsPass>());
    // TODO: Enable this once it handles Poppy blocks correctly
    // subRunner.add(std::make_unique<ReFinalize>());
    subRunner.run();
    lowerTupleGlobals(module);
  }